

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::BasicWriter<char>::write(BasicWriter<char> *this,int __fd,void *__buf,size_t __n)

{
  BasicCStringRef<char> format_str;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> local_48;
  
  local_48.super_FormatterBase.next_arg_index_ = 0;
  local_48.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_str.data_._4_4_ = in_register_00000034;
  format_str.data_._0_4_ = __fd;
  local_48.super_FormatterBase.args_.types_ = (uint64_t)__buf;
  local_48.super_FormatterBase.args_.field_1 = (anon_union_8_2_de49483c_for_ArgList_1)__n;
  local_48.writer_ = this;
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::format(&local_48,format_str);
  std::
  _Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ::~_Vector_base((_Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
                   *)&local_48.map_);
  return extraout_RAX;
}

Assistant:

BasicFormatter(const ArgList &args, BasicWriter<Char> &w)
    : internal::FormatterBase(args), writer_(w) {}